

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock.c
# Opt level: O1

cf_bool_t cf_sock_close(cf_sock_t sock)

{
  int iVar1;
  
  if (sock != -1) {
    iVar1 = close(sock);
    return (uint)(iVar1 == 0);
  }
  return 1;
}

Assistant:

cf_bool_t cf_sock_close(cf_sock_t sock) {
    if (sock != CF_SOCK_INVALID) {
#ifdef CF_OS_WIN
        return closesocket(sock) == 0;
#else
        return close(sock) == 0;
#endif
    }
    return CF_TRUE;
}